

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

int __thiscall amrex::BoxArray::readFrom(BoxArray *this,istream *is)

{
  uint uVar1;
  element_type *peVar2;
  pointer pBVar3;
  undefined8 in_RAX;
  int ndims;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  clear(this);
  BARef::define((this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr,is
                ,&local_14);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pBVar3 = (peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar3 != *(pointer *)
                 ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data + 8)) {
    uVar1 = (pBVar3->btype).itype;
    (this->m_bat).m_bat_type = (uint)(uVar1 != 0);
    (this->m_bat).m_op.m_indexType.m_typ.itype = uVar1;
    type_update(this);
  }
  return local_14;
}

Assistant:

int
BoxArray::readFrom (std::istream& is)
{
    BL_ASSERT(size() == 0);
    clear();
    int ndims;
    m_ref->define(is, ndims);
    if (! m_ref->m_abox.empty()) {
        m_bat = BATransformer(m_ref->m_abox[0].ixType());
        type_update();
    }
    return ndims;
}